

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O0

unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
 __thiscall Clique::getAllAlignments(Clique *this)

{
  undefined8 *puVar1;
  pointer pos;
  pointer this_00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  long in_RSI;
  _Head_base<0UL,_std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_*,_false>
  in_RDI;
  size_t i;
  unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
  *result;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
  *in_stack_ffffffffffffff90;
  pointer local_20;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>::vector
            ((vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_> *)0x25f0cf);
  std::
  unique_ptr<std::vector<AlignmentRecord_const*,std::allocator<AlignmentRecord_const*>>,std::default_delete<std::vector<AlignmentRecord_const*,std::allocator<AlignmentRecord_const*>>>>
  ::
  unique_ptr<std::default_delete<std::vector<AlignmentRecord_const*,std::allocator<AlignmentRecord_const*>>>,void>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pos = (pointer)boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                           ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                            0x25f0ec);
  local_20 = pos;
  while (local_20 != (pointer)0xffffffffffffffff) {
    this_00 = std::
              unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
              ::operator->((unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
                            *)0x25f113);
    this_01 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
              (**(code **)(**(long **)(in_RSI + 0x28) + 0x28))(*(long **)(in_RSI + 0x28),local_20);
    std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>::push_back
              (this_00,(value_type *)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff88 =
         (pointer)boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                            (this_01,(size_type)pos);
    local_20 = in_stack_ffffffffffffff88;
  }
  return (__uniq_ptr_data<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>,_true,_true>
            )in_RDI._M_head_impl;
}

Assistant:

unique_ptr<vector<const AlignmentRecord*> > Clique::getAllAlignments() const {
	unique_ptr<vector<const AlignmentRecord*> > result(new vector<const AlignmentRecord*>());
	for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
		result->push_back(&parent.getAlignmentByIndex(i));
	}
	return result;
}